

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_reserve.c
# Opt level: O3

mpt_command * mpt_command_reserve(mpt_array *arr,size_t max)

{
  undefined1 *puVar1;
  _mpt_vptr_buffer **pp_Var2;
  mpt_buffer *pmVar3;
  ulong uVar4;
  _mpt_vptr_buffer **pp_Var5;
  mpt_type_traits *pmVar6;
  ulong uVar7;
  mpt_command *pmVar8;
  _mpt_vptr_buffer **pp_Var9;
  void *pvVar10;
  size_t elem;
  void *id;
  _mpt_vptr_buffer *p_Var11;
  bool bVar12;
  
  switch(max) {
  case 0:
    return (mpt_command *)0x0;
  case 1:
    pvVar10 = (void *)0x7f;
    break;
  case 2:
    pvVar10 = (void *)0x7fff;
    break;
  case 3:
    pvVar10 = (void *)0x7fffff;
    break;
  case 4:
    pvVar10 = (void *)0x7fffffff;
    break;
  case 5:
    pvVar10 = (void *)0x7fffffffff;
    break;
  case 6:
    pvVar10 = (void *)0x7fffffffffff;
    break;
  case 7:
    pvVar10 = (void *)0x7fffffffffffff;
    break;
  default:
    pvVar10 = (void *)0x7fffffffffffffff;
  }
  pmVar3 = arr->_buf;
  if (pmVar3 == (mpt_buffer *)0x0) {
    pmVar8 = (mpt_command *)mpt_array_append(arr,0xc0,(void *)0x0);
    if (pmVar8 == (mpt_command *)0x0) {
      return (mpt_command *)0x0;
    }
    pmVar8->id = 1;
    pmVar8->cmd = log_reply;
    id = (void *)0x1;
  }
  else {
    uVar4 = pmVar3->_used;
    if (uVar4 < 0x18) {
      pmVar3->_used = 0;
      id = (void *)0x1;
    }
    else {
      p_Var11 = (_mpt_vptr_buffer *)0x0;
      elem = 0;
      uVar7 = 0;
      pp_Var9 = (_mpt_vptr_buffer **)0x0;
      do {
        pp_Var2 = &pmVar3[1]._vptr + uVar7 * 3;
        if (p_Var11 < *pp_Var2) {
          p_Var11 = *pp_Var2;
        }
        if ((mpt_type_traits *)pp_Var2[1] == (mpt_type_traits *)0x0) {
          if (pp_Var9 == (_mpt_vptr_buffer **)0x0) {
            pp_Var9 = pp_Var2;
          }
        }
        else {
          elem = elem + 1;
          if (pp_Var9 == (_mpt_vptr_buffer **)0x0) {
            pp_Var9 = (_mpt_vptr_buffer **)0x0;
          }
          else {
            pp_Var9[2] = pp_Var2[2];
            pmVar6 = (mpt_type_traits *)pp_Var2[1];
            *pp_Var9 = *pp_Var2;
            pp_Var9[1] = (_mpt_vptr_buffer *)pmVar6;
            pp_Var2[1] = (_mpt_vptr_buffer *)0x0;
            pp_Var5 = pp_Var9;
            do {
              pp_Var9 = pp_Var5 + 3;
              if (pp_Var2 <= pp_Var9) break;
              puVar1 = (undefined1 *)(pp_Var5 + 4);
              pp_Var5 = pp_Var9;
            } while (*(long *)puVar1 != 0);
          }
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar4 / 0x18);
      id = (void *)((long)&p_Var11->get_flags + 1);
      pmVar3->_used = elem * 0x18;
      if (pvVar10 < id) {
        id = (void *)0x1;
        while (pmVar8 = mpt_command_find((mpt_command *)(pmVar3 + 1),elem,(uintptr_t)id),
              pmVar8 != (mpt_command *)0x0) {
          bVar12 = id == pvVar10;
          id = (void *)((long)id + 1);
          if (bVar12) {
            return (mpt_command *)0x0;
          }
        }
      }
    }
    pmVar8 = (mpt_command *)mpt_array_append(arr,0x18,(void *)0x0);
    if (pmVar8 == (mpt_command *)0x0) {
      return (mpt_command *)0x0;
    }
    pmVar8->id = (uintptr_t)id;
    pmVar8->cmd = log_reply;
  }
  pmVar8->arg = id;
  return pmVar8;
}

Assistant:

extern MPT_STRUCT(command) *mpt_command_reserve(MPT_STRUCT(array) *arr, size_t max)
{
	MPT_STRUCT(buffer) *msg;
	MPT_STRUCT(command) *base, *cmd = 0;
	size_t i, len, used = 0;
	uintptr_t mid = 0;
	
	
	switch (max) {
	  case 0: return 0;
	  case 1: max = INT8_MAX; break;
	  case 2: max = INT16_MAX; break;
	  case 3: max = INT32_MAX/0x100; break;
	  case 4: max = INT32_MAX; break;
	  case 5: max = INT64_MAX/0x1000000; break;
	  case 6: max = INT64_MAX/0x10000; break;
	  case 7: max = INT64_MAX/0x100; break;
	  default: max = INT64_MAX;
	}
	if (max > INTPTR_MAX) {
		max = INTPTR_MAX;
	}
	/* command data on buffer */
	if ((msg = arr->_buf)) {
		len  = msg->_used / sizeof(*cmd);
		base = (void *) (msg+1);
	} else {
		if ((cmd = mpt_array_append(arr, sizeof(*cmd) * 8, 0))) {
			static const uintptr_t firstId = 1;
			cmd->id  = firstId;
			cmd->cmd = log_reply;
			cmd->arg = (void *) firstId;
		}
		return cmd;
	}
	for (i = 0; i < len; ++i) {
		/* find highest previous id */
		if (base[i].id > mid) {
			mid = base[i].id;
		}
		/* save available space */
		if (!base[i].cmd) {
			if (!cmd) {
				cmd = base+i;
			}
			continue;
		}
		/* track number of active commands */
		++used;
		
		/* no smaller position available */
		if (!cmd) continue;
		
		/* move command entry */
		*cmd = base[i];
		base[i].cmd = 0;
		
		/* find smallest free position */
		while (++cmd < (base+i)) {
			if (!cmd->cmd) {
				break;
			}
		}
	}
	/* save used size */
	msg->_used = used * sizeof(*cmd);
	
	/* try to find low free id */
	if (++mid > max) {
		for (i = 1; i <= max; ++i) {
			if (!mpt_command_find(base, used, i)) {
				mid = i;
				break;
			}
		}
		/* no unique message id available */
		if (i > max) {
			return 0;
		}
	}
	/* add command slot */
	if (!(cmd = mpt_array_append(arr, sizeof(*cmd), 0))) {
		return 0;
	}
	
	/* setup default handling */
	cmd->id  = mid;
	cmd->cmd = log_reply;
	cmd->arg = (void *) mid;
	
	return cmd;
}